

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall nn::ESoinn::deleteNeuron(ESoinn *this,uint32_t number)

{
  AbstractWeightVector *pAVar1;
  ConcreteLogger *this_00;
  pointer pEVar2;
  uint uVar3;
  ulong uVar4;
  string local_50;
  allocator local_29;
  
  this_00 = log_netw;
  std::__cxx11::string::string((string *)&local_50,"deleteNeuron function",&local_29);
  logger::ConcreteLogger::debug(this_00,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  pEVar2 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = pEVar2[number].super_AbstractNeuron.m_wv;
  if (pAVar1 != (AbstractWeightVector *)0x0) {
    (*pAVar1->_vptr_AbstractWeightVector[7])(pAVar1);
    pEVar2 = (this->m_Neurons).
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_start;
  }
  pEVar2[number].m_IsDeleted = true;
  for (uVar3 = 0; uVar4 = (ulong)uVar3,
      uVar4 < (ulong)(((long)(this->m_Neurons).
                             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) / 0x88);
      uVar3 = uVar3 + 1) {
    if (pEVar2[uVar4].m_IsDeleted == false) {
      neuron::ESoinnNeuron::deleteConcreteNeighbour(pEVar2 + uVar4,number);
      pEVar2 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
  }
  return;
}

Assistant:

void ESoinn::deleteNeuron(uint32_t number)
    { 
        log_netw->debug("deleteNeuron function");
        //delete neuron with number
        delete m_Neurons[number].getWv();   
        m_Neurons[number].setDeleted();
        
        //delete all connections between other neurons and deleted neuron
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            m_Neurons[i].deleteConcreteNeighbour(number);    
        }    
    }